

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O2

void Intp_ManPrintClause(Intp_Man_t *p,Sto_Cls_t *pClause)

{
  ulong uVar1;
  
  printf("Clause ID = %d. Proof = %d. {",(long)pClause->Id,(ulong)(uint)p->pProofNums[pClause->Id]);
  for (uVar1 = 0; uVar1 < (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff); uVar1 = uVar1 + 1) {
    printf(" %d",(ulong)*(uint *)((long)&pClause[1].pNext + uVar1 * 4));
  }
  puts(" }");
  return;
}

Assistant:

void Intp_ManPrintClause( Intp_Man_t * p, Sto_Cls_t * pClause )
{
    int i;
    printf( "Clause ID = %d. Proof = %d. {", pClause->Id, Intp_ManProofGet(p, pClause) );
    for ( i = 0; i < (int)pClause->nLits; i++ )
        printf( " %d", pClause->pLits[i] );
    printf( " }\n" );
}